

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Writer.cpp
# Opt level: O0

void __thiscall
OSTEI_VRR_Writer::WriteVRRSteps_
          (OSTEI_VRR_Writer *this,ostream *os,QAM *am,VRR_StepSet *vs,string *num_n)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  const_reference pvVar5;
  undefined8 in_RCX;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  int __c_03;
  int __c_04;
  int __c_05;
  int __c_06;
  int __c_07;
  char *in_RDX;
  ostream *in_RSI;
  string *in_R8;
  string qpa;
  string ppa;
  string vrr_const3;
  string vrr_const2;
  string vrr_const1;
  string vrr_const0;
  string aover;
  string aoppq;
  string primname;
  string stepdir;
  XYZStep step;
  VRRStep *it;
  iterator __end1;
  iterator __begin1;
  VRR_StepSet *__range1;
  QAM *in_stack_fffffffffffff418;
  Quartet *in_stack_fffffffffffff420;
  QAM *in_stack_fffffffffffff440;
  QAM *local_bb0;
  QAM *in_stack_fffffffffffff468;
  ostream *in_stack_fffffffffffff470;
  Quartet *in_stack_fffffffffffff478;
  ostream *in_stack_fffffffffffff480;
  ostream *in_stack_fffffffffffff488;
  ostream *in_stack_fffffffffffff490;
  undefined7 in_stack_fffffffffffff498;
  undefined1 in_stack_fffffffffffff49f;
  ostream *in_stack_fffffffffffff4b0;
  string *local_8f0;
  string local_898 [32];
  string local_878 [32];
  string local_858 [32];
  string local_838 [32];
  string local_818 [32];
  string local_7f8 [32];
  string local_7d8 [32];
  string local_7b8 [32];
  string local_798 [32];
  string local_778 [32];
  string local_758 [32];
  string local_738 [32];
  string local_718 [32];
  string local_6f8 [32];
  string local_6d8 [32];
  string local_6b8 [32];
  string local_698 [32];
  string local_678 [32];
  string local_658 [32];
  string local_638 [32];
  undefined4 local_618;
  int local_614;
  string local_5e0 [32];
  string local_5c0 [32];
  undefined4 local_5a0;
  int local_59c;
  string local_568 [32];
  string local_548 [32];
  undefined4 local_528;
  int local_524;
  string local_4f0 [32];
  string local_4d0 [32];
  undefined4 local_4b0;
  int local_4ac;
  string local_478 [32];
  string local_458 [32];
  undefined4 local_438;
  int local_434;
  string local_400 [32];
  string local_3e0 [32];
  undefined4 local_3c0;
  int local_3bc;
  string local_388 [32];
  string local_368 [32];
  undefined4 local_348;
  int local_344;
  string local_310 [32];
  string local_2f0 [32];
  undefined4 local_2d0;
  int local_2cc;
  string local_298 [32];
  string local_278 [32];
  undefined1 local_258 [64];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  QAM QStack_158;
  int local_11c;
  string local_118 [32];
  string local_f8 [36];
  XYZStep local_d4;
  string local_d0 [36];
  XYZStep local_ac;
  reference local_a8;
  _Self local_a0;
  _Self local_98;
  undefined8 local_90;
  string local_48 [32];
  string *local_28;
  undefined8 local_20;
  ostream *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  std::operator<<(in_RSI,"\n");
  poVar3 = std::operator<<(local_10,(string *)indent5_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"// Forming ");
  PrimVarName_abi_cxx11_(in_stack_fffffffffffff468);
  poVar3 = std::operator<<(poVar3,local_48);
  poVar3 = std::operator<<(poVar3,"[");
  poVar3 = std::operator<<(poVar3,local_28);
  poVar3 = std::operator<<(poVar3," * ");
  QAM::QAM((QAM *)in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  iVar2 = NCART(in_stack_fffffffffffff440);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::operator<<(poVar3,"];\n");
  QAM::~QAM((QAM *)0x13eddb);
  std::__cxx11::string::~string(local_48);
  poVar3 = std::operator<<(local_10,(string *)indent5_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"for(n = 0; n < ");
  poVar3 = std::operator<<(poVar3,local_28);
  std::operator<<(poVar3,"; ++n)  // loop over orders of auxiliary function\n");
  poVar3 = std::operator<<(local_10,(string *)indent5_abi_cxx11_);
  std::operator<<(poVar3,"{\n");
  std::operator<<(local_10,"\n");
  local_90 = local_20;
  local_98._M_node =
       (_Base_ptr)
       std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>::begin
                 ((set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_> *)
                  in_stack_fffffffffffff418);
  local_a0._M_node =
       (_Base_ptr)
       std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>::end
                 ((set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_> *)
                  in_stack_fffffffffffff418);
  while (bVar1 = std::operator!=(&local_98,&local_a0), bVar1) {
    local_a8 = std::_Rb_tree_const_iterator<VRRStep>::operator*
                         ((_Rb_tree_const_iterator<VRRStep> *)0x13eec6);
    local_d4 = local_a8->xyz;
    local_ac = local_d4;
    StringBuilder<char[2],int,char_const(&)[2]>
              ((char (*) [2])in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480,
               (char (*) [2])in_stack_fffffffffffff478);
    PrimVarName_abi_cxx11_(in_stack_fffffffffffff468);
    pcVar4 = in_RDX;
    QAM::QAM((QAM *)in_stack_fffffffffffff420,in_stack_fffffffffffff418);
    local_11c = NCART(in_stack_fffffffffffff440);
    pcVar4 = Quartet::index(&local_a8->target,pcVar4,__c);
    QStack_158.qam._M_elems[1] = (int)pcVar4;
    in_stack_fffffffffffff418 = (QAM *)0x17d138;
    StringBuilder<std::__cxx11::string,char_const(&)[6],int,char_const(&)[4],int,char_const(&)[2]>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498),
               (char (*) [6])in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488,
               (char (*) [4])in_stack_fffffffffffff480,(int *)in_stack_fffffffffffff478,
               (char (*) [2])in_stack_fffffffffffff4b0);
    QAM::~QAM((QAM *)0x13efdd);
    std::__cxx11::string::~string(local_118);
    local_8f0 = (string *)local_258;
    do {
      std::__cxx11::string::string(local_8f0);
      local_8f0 = local_8f0 + 0x20;
    } while ((QAM *)local_8f0 != &QStack_158);
    std::array<Quartet,_8UL>::operator[]
              ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418
              );
    bVar1 = Quartet::operator_cast_to_bool(in_stack_fffffffffffff420);
    if (bVar1) {
      std::array<Quartet,_8UL>::operator[]
                ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,
                 (size_type)in_stack_fffffffffffff418);
      Quartet::amlist(in_stack_fffffffffffff478);
      PrimVarName_abi_cxx11_(in_stack_fffffffffffff468);
      std::array<Quartet,_8UL>::operator[]
                ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,
                 (size_type)in_stack_fffffffffffff418);
      local_2cc = Quartet::ncart(in_stack_fffffffffffff420);
      pcVar4 = (char *)0x0;
      pvVar5 = std::array<Quartet,_8UL>::operator[]
                         ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,
                          (size_type)in_stack_fffffffffffff418);
      pcVar4 = Quartet::index(pvVar5,pcVar4,__c_00);
      local_2d0 = SUB84(pcVar4,0);
      in_stack_fffffffffffff418 = (QAM *)0x17d138;
      StringBuilder<std::__cxx11::string,char_const(&)[6],int,char_const(&)[4],int,char_const(&)[2]>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498),
                 (char (*) [6])in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488,
                 (char (*) [4])in_stack_fffffffffffff480,(int *)in_stack_fffffffffffff478,
                 (char (*) [2])in_stack_fffffffffffff4b0);
      std::__cxx11::string::operator=((string *)local_258,local_278);
      std::__cxx11::string::~string(local_278);
      std::__cxx11::string::~string(local_298);
      QAM::~QAM((QAM *)0x13f1a8);
    }
    std::array<Quartet,_8UL>::operator[]
              ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418
              );
    bVar1 = Quartet::operator_cast_to_bool(in_stack_fffffffffffff420);
    if (bVar1) {
      std::array<Quartet,_8UL>::operator[]
                ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,
                 (size_type)in_stack_fffffffffffff418);
      Quartet::amlist(in_stack_fffffffffffff478);
      PrimVarName_abi_cxx11_(in_stack_fffffffffffff468);
      std::array<Quartet,_8UL>::operator[]
                ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,
                 (size_type)in_stack_fffffffffffff418);
      local_344 = Quartet::ncart(in_stack_fffffffffffff420);
      pcVar4 = (char *)0x1;
      pvVar5 = std::array<Quartet,_8UL>::operator[]
                         ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,
                          (size_type)in_stack_fffffffffffff418);
      pcVar4 = Quartet::index(pvVar5,pcVar4,__c_01);
      local_348 = SUB84(pcVar4,0);
      in_stack_fffffffffffff418 = (QAM *)0x17d138;
      StringBuilder<std::__cxx11::string,char_const(&)[10],int,char_const(&)[4],int,char_const(&)[2]>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498),
                 (char (*) [10])in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488,
                 (char (*) [4])in_stack_fffffffffffff480,(int *)in_stack_fffffffffffff478,
                 (char (*) [2])in_stack_fffffffffffff4b0);
      std::__cxx11::string::operator=((string *)(local_258 + 0x20),local_2f0);
      std::__cxx11::string::~string(local_2f0);
      std::__cxx11::string::~string(local_310);
      QAM::~QAM((QAM *)0x13f428);
    }
    std::array<Quartet,_8UL>::operator[]
              ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418
              );
    bVar1 = Quartet::operator_cast_to_bool(in_stack_fffffffffffff420);
    if (bVar1) {
      std::array<Quartet,_8UL>::operator[]
                ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,
                 (size_type)in_stack_fffffffffffff418);
      Quartet::amlist(in_stack_fffffffffffff478);
      PrimVarName_abi_cxx11_(in_stack_fffffffffffff468);
      std::array<Quartet,_8UL>::operator[]
                ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,
                 (size_type)in_stack_fffffffffffff418);
      local_3bc = Quartet::ncart(in_stack_fffffffffffff420);
      pcVar4 = (char *)0x2;
      pvVar5 = std::array<Quartet,_8UL>::operator[]
                         ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,
                          (size_type)in_stack_fffffffffffff418);
      pcVar4 = Quartet::index(pvVar5,pcVar4,__c_02);
      local_3c0 = SUB84(pcVar4,0);
      in_stack_fffffffffffff418 = (QAM *)0x17d138;
      StringBuilder<std::__cxx11::string,char_const(&)[6],int,char_const(&)[4],int,char_const(&)[2]>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498),
                 (char (*) [6])in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488,
                 (char (*) [4])in_stack_fffffffffffff480,(int *)in_stack_fffffffffffff478,
                 (char (*) [2])in_stack_fffffffffffff4b0);
      std::__cxx11::string::operator=(local_218,local_368);
      std::__cxx11::string::~string(local_368);
      std::__cxx11::string::~string(local_388);
      QAM::~QAM((QAM *)0x13f5e1);
    }
    std::array<Quartet,_8UL>::operator[]
              ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418
              );
    bVar1 = Quartet::operator_cast_to_bool(in_stack_fffffffffffff420);
    if (bVar1) {
      std::array<Quartet,_8UL>::operator[]
                ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,
                 (size_type)in_stack_fffffffffffff418);
      Quartet::amlist(in_stack_fffffffffffff478);
      PrimVarName_abi_cxx11_(in_stack_fffffffffffff468);
      std::array<Quartet,_8UL>::operator[]
                ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,
                 (size_type)in_stack_fffffffffffff418);
      local_434 = Quartet::ncart(in_stack_fffffffffffff420);
      pcVar4 = (char *)0x3;
      pvVar5 = std::array<Quartet,_8UL>::operator[]
                         ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,
                          (size_type)in_stack_fffffffffffff418);
      pcVar4 = Quartet::index(pvVar5,pcVar4,__c_03);
      local_438 = SUB84(pcVar4,0);
      in_stack_fffffffffffff418 = (QAM *)0x17d138;
      StringBuilder<std::__cxx11::string,char_const(&)[10],int,char_const(&)[4],int,char_const(&)[2]>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498),
                 (char (*) [10])in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488,
                 (char (*) [4])in_stack_fffffffffffff480,(int *)in_stack_fffffffffffff478,
                 (char (*) [2])in_stack_fffffffffffff4b0);
      std::__cxx11::string::operator=(local_1f8,local_3e0);
      std::__cxx11::string::~string(local_3e0);
      std::__cxx11::string::~string(local_400);
      QAM::~QAM((QAM *)0x13f79a);
    }
    std::array<Quartet,_8UL>::operator[]
              ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418
              );
    bVar1 = Quartet::operator_cast_to_bool(in_stack_fffffffffffff420);
    if (bVar1) {
      std::array<Quartet,_8UL>::operator[]
                ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,
                 (size_type)in_stack_fffffffffffff418);
      Quartet::amlist(in_stack_fffffffffffff478);
      PrimVarName_abi_cxx11_(in_stack_fffffffffffff468);
      std::array<Quartet,_8UL>::operator[]
                ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,
                 (size_type)in_stack_fffffffffffff418);
      local_4ac = Quartet::ncart(in_stack_fffffffffffff420);
      pcVar4 = (char *)0x4;
      pvVar5 = std::array<Quartet,_8UL>::operator[]
                         ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,
                          (size_type)in_stack_fffffffffffff418);
      pcVar4 = Quartet::index(pvVar5,pcVar4,__c_04);
      local_4b0 = SUB84(pcVar4,0);
      in_stack_fffffffffffff418 = (QAM *)0x17d138;
      StringBuilder<std::__cxx11::string,char_const(&)[6],int,char_const(&)[4],int,char_const(&)[2]>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498),
                 (char (*) [6])in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488,
                 (char (*) [4])in_stack_fffffffffffff480,(int *)in_stack_fffffffffffff478,
                 (char (*) [2])in_stack_fffffffffffff4b0);
      std::__cxx11::string::operator=(local_1d8,local_458);
      std::__cxx11::string::~string(local_458);
      std::__cxx11::string::~string(local_478);
      QAM::~QAM((QAM *)0x13f956);
    }
    std::array<Quartet,_8UL>::operator[]
              ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418
              );
    bVar1 = Quartet::operator_cast_to_bool(in_stack_fffffffffffff420);
    if (bVar1) {
      std::array<Quartet,_8UL>::operator[]
                ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,
                 (size_type)in_stack_fffffffffffff418);
      Quartet::amlist(in_stack_fffffffffffff478);
      PrimVarName_abi_cxx11_(in_stack_fffffffffffff468);
      std::array<Quartet,_8UL>::operator[]
                ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,
                 (size_type)in_stack_fffffffffffff418);
      local_524 = Quartet::ncart(in_stack_fffffffffffff420);
      pcVar4 = (char *)0x5;
      pvVar5 = std::array<Quartet,_8UL>::operator[]
                         ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,
                          (size_type)in_stack_fffffffffffff418);
      pcVar4 = Quartet::index(pvVar5,pcVar4,__c_05);
      local_528 = SUB84(pcVar4,0);
      in_stack_fffffffffffff418 = (QAM *)0x17d138;
      StringBuilder<std::__cxx11::string,char_const(&)[10],int,char_const(&)[4],int,char_const(&)[2]>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498),
                 (char (*) [10])in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488,
                 (char (*) [4])in_stack_fffffffffffff480,(int *)in_stack_fffffffffffff478,
                 (char (*) [2])in_stack_fffffffffffff4b0);
      std::__cxx11::string::operator=(local_1b8,local_4d0);
      std::__cxx11::string::~string(local_4d0);
      std::__cxx11::string::~string(local_4f0);
      QAM::~QAM((QAM *)0x13fb12);
    }
    std::array<Quartet,_8UL>::operator[]
              ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418
              );
    bVar1 = Quartet::operator_cast_to_bool(in_stack_fffffffffffff420);
    if (bVar1) {
      std::array<Quartet,_8UL>::operator[]
                ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,
                 (size_type)in_stack_fffffffffffff418);
      Quartet::amlist(in_stack_fffffffffffff478);
      PrimVarName_abi_cxx11_(in_stack_fffffffffffff468);
      std::array<Quartet,_8UL>::operator[]
                ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,
                 (size_type)in_stack_fffffffffffff418);
      local_59c = Quartet::ncart(in_stack_fffffffffffff420);
      pcVar4 = (char *)0x6;
      pvVar5 = std::array<Quartet,_8UL>::operator[]
                         ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,
                          (size_type)in_stack_fffffffffffff418);
      pcVar4 = Quartet::index(pvVar5,pcVar4,__c_06);
      local_5a0 = SUB84(pcVar4,0);
      in_stack_fffffffffffff418 = (QAM *)0x17d138;
      StringBuilder<std::__cxx11::string,char_const(&)[10],int,char_const(&)[4],int,char_const(&)[2]>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498),
                 (char (*) [10])in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488,
                 (char (*) [4])in_stack_fffffffffffff480,(int *)in_stack_fffffffffffff478,
                 (char (*) [2])in_stack_fffffffffffff4b0);
      std::__cxx11::string::operator=(local_198,local_548);
      std::__cxx11::string::~string(local_548);
      std::__cxx11::string::~string(local_568);
      QAM::~QAM((QAM *)0x13fcce);
    }
    std::array<Quartet,_8UL>::operator[]
              ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418
              );
    bVar1 = Quartet::operator_cast_to_bool(in_stack_fffffffffffff420);
    if (bVar1) {
      std::array<Quartet,_8UL>::operator[]
                ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,
                 (size_type)in_stack_fffffffffffff418);
      Quartet::amlist(in_stack_fffffffffffff478);
      PrimVarName_abi_cxx11_(in_stack_fffffffffffff468);
      std::array<Quartet,_8UL>::operator[]
                ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,
                 (size_type)in_stack_fffffffffffff418);
      local_614 = Quartet::ncart(in_stack_fffffffffffff420);
      pcVar4 = (char *)0x7;
      pvVar5 = std::array<Quartet,_8UL>::operator[]
                         ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,
                          (size_type)in_stack_fffffffffffff418);
      pcVar4 = Quartet::index(pvVar5,pcVar4,__c_07);
      local_618 = SUB84(pcVar4,0);
      in_stack_fffffffffffff418 = (QAM *)0x17d138;
      StringBuilder<std::__cxx11::string,char_const(&)[10],int,char_const(&)[4],int,char_const(&)[2]>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498),
                 (char (*) [10])in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488,
                 (char (*) [4])in_stack_fffffffffffff480,(int *)in_stack_fffffffffffff478,
                 (char (*) [2])in_stack_fffffffffffff4b0);
      std::__cxx11::string::operator=(local_178,local_5c0);
      std::__cxx11::string::~string(local_5c0);
      std::__cxx11::string::~string(local_5e0);
      QAM::~QAM((QAM *)0x13fe8a);
    }
    std::__cxx11::string::string(local_638);
    std::__cxx11::string::string(local_658);
    std::__cxx11::string::string(local_678);
    std::__cxx11::string::string(local_698);
    std::__cxx11::string::string(local_6b8);
    std::__cxx11::string::string(local_6d8);
    if ((local_a8->type == I) || (local_a8->type == J)) {
      StringBuilder<char[7],std::__cxx11::string&>
                ((char (*) [7])in_stack_fffffffffffff478,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff470);
      std::__cxx11::string::operator=(local_638,local_6f8);
      std::__cxx11::string::~string(local_6f8);
      std::__cxx11::string::operator=(local_658,"a_over_p");
      std::array<int,_4UL>::operator[]
                ((array<int,_4UL> *)in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
      StringBuilder<char[11],int_const&,char_const(&)[9]>
                ((char (*) [11])in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480,
                 (char (*) [9])in_stack_fffffffffffff478);
      std::__cxx11::string::operator=(local_678,local_718);
      std::__cxx11::string::~string(local_718);
      std::array<int,_4UL>::operator[]
                ((array<int,_4UL> *)in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
      StringBuilder<char[11],int_const&,char_const(&)[9]>
                ((char (*) [11])in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480,
                 (char (*) [9])in_stack_fffffffffffff478);
      std::__cxx11::string::operator=(local_698,local_738);
      std::__cxx11::string::~string(local_738);
      std::array<int,_4UL>::operator[]
                ((array<int,_4UL> *)in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
      StringBuilder<char[11],int_const&,char_const(&)[10]>
                ((char (*) [11])in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480,
                 (char (*) [10])in_stack_fffffffffffff478);
      std::__cxx11::string::operator=(local_6b8,local_758);
      std::__cxx11::string::~string(local_758);
      std::array<int,_4UL>::operator[]
                ((array<int,_4UL> *)in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
      StringBuilder<char[11],int_const&,char_const(&)[10]>
                ((char (*) [11])in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480,
                 (char (*) [10])in_stack_fffffffffffff478);
      std::__cxx11::string::operator=(local_6d8,local_778);
      std::__cxx11::string::~string(local_778);
    }
    else {
      StringBuilder<char[7],std::__cxx11::string&>
                ((char (*) [7])in_stack_fffffffffffff478,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff470);
      std::__cxx11::string::operator=(local_638,local_798);
      std::__cxx11::string::~string(local_798);
      std::__cxx11::string::operator=(local_658,"a_over_q");
      std::array<int,_4UL>::operator[]
                ((array<int,_4UL> *)in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
      StringBuilder<char[11],int_const&,char_const(&)[9]>
                ((char (*) [11])in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480,
                 (char (*) [9])in_stack_fffffffffffff478);
      std::__cxx11::string::operator=(local_678,local_7b8);
      std::__cxx11::string::~string(local_7b8);
      std::array<int,_4UL>::operator[]
                ((array<int,_4UL> *)in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
      StringBuilder<char[11],int_const&,char_const(&)[9]>
                ((char (*) [11])in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480,
                 (char (*) [9])in_stack_fffffffffffff478);
      std::__cxx11::string::operator=(local_698,local_7d8);
      std::__cxx11::string::~string(local_7d8);
      std::array<int,_4UL>::operator[]
                ((array<int,_4UL> *)in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
      StringBuilder<char[11],int_const&,char_const(&)[10]>
                ((char (*) [11])in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480,
                 (char (*) [10])in_stack_fffffffffffff478);
      std::__cxx11::string::operator=(local_6b8,local_7f8);
      std::__cxx11::string::~string(local_7f8);
      std::array<int,_4UL>::operator[]
                ((array<int,_4UL> *)in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
      StringBuilder<char[11],int_const&,char_const(&)[10]>
                ((char (*) [11])in_stack_fffffffffffff488,(int *)in_stack_fffffffffffff480,
                 (char (*) [10])in_stack_fffffffffffff478);
      std::__cxx11::string::operator=(local_6d8,local_818);
      std::__cxx11::string::~string(local_818);
    }
    if ((local_a8->type == I) || (local_a8->type == J)) {
      StringBuilder<char[5],std::__cxx11::string&>
                ((char (*) [5])in_stack_fffffffffffff478,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff470);
      if (local_a8->type != I) {
        StringBuilder<char[5],std::__cxx11::string&>
                  ((char (*) [5])in_stack_fffffffffffff478,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff470);
        std::__cxx11::string::operator=(local_838,local_858);
        std::__cxx11::string::~string(local_858);
      }
      poVar3 = std::operator<<(local_10,(string *)indent6_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,local_f8);
      poVar3 = std::operator<<(poVar3," = SIMINT_MUL(");
      poVar3 = std::operator<<(poVar3,local_838);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = std::operator<<(poVar3,(string *)local_258);
      std::operator<<(poVar3,");\n");
      std::__cxx11::string::~string(local_838);
    }
    else {
      StringBuilder<char[5],std::__cxx11::string&>
                ((char (*) [5])in_stack_fffffffffffff478,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff470);
      if (local_a8->type != K) {
        StringBuilder<char[5],std::__cxx11::string&>
                  ((char (*) [5])in_stack_fffffffffffff478,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff470);
        std::__cxx11::string::operator=(local_878,local_898);
        std::__cxx11::string::~string(local_898);
      }
      poVar3 = std::operator<<(local_10,(string *)indent6_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,local_f8);
      poVar3 = std::operator<<(poVar3," = SIMINT_MUL(");
      poVar3 = std::operator<<(poVar3,local_878);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = std::operator<<(poVar3,(string *)local_258);
      std::operator<<(poVar3,");\n");
      std::__cxx11::string::~string(local_878);
    }
    std::array<Quartet,_8UL>::operator[]
              ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418
              );
    bVar1 = Quartet::operator_cast_to_bool(in_stack_fffffffffffff420);
    if (bVar1) {
      poVar3 = std::operator<<(local_10,(string *)indent6_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,local_f8);
      poVar3 = std::operator<<(poVar3," = SIMINT_FMADD( ");
      poVar3 = std::operator<<(poVar3,local_638);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = std::operator<<(poVar3,(string *)(local_258 + 0x20));
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = std::operator<<(poVar3,local_f8);
      std::operator<<(poVar3,");\n");
    }
    std::array<Quartet,_8UL>::operator[]
              ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418
              );
    bVar1 = Quartet::operator_cast_to_bool(in_stack_fffffffffffff420);
    if (bVar1) {
      std::array<Quartet,_8UL>::operator[]
                ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,
                 (size_type)in_stack_fffffffffffff418);
      bVar1 = Quartet::operator_cast_to_bool(in_stack_fffffffffffff420);
      if (bVar1) {
        poVar3 = std::operator<<(local_10,(string *)indent6_abi_cxx11_);
        poVar3 = std::operator<<(poVar3,local_f8);
        poVar3 = std::operator<<(poVar3," = SIMINT_FMADD( ");
        poVar3 = std::operator<<(poVar3,local_678);
        poVar3 = std::operator<<(poVar3,", SIMINT_FMADD(");
        poVar3 = std::operator<<(poVar3,local_658);
        poVar3 = std::operator<<(poVar3,", ");
        poVar3 = std::operator<<(poVar3,local_1f8);
        poVar3 = std::operator<<(poVar3,", ");
        poVar3 = std::operator<<(poVar3,local_218);
        poVar3 = std::operator<<(poVar3,"), ");
        poVar3 = std::operator<<(poVar3,local_f8);
        std::operator<<(poVar3,");\n");
      }
    }
    std::array<Quartet,_8UL>::operator[]
              ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418
              );
    bVar1 = Quartet::operator_cast_to_bool(in_stack_fffffffffffff420);
    if (bVar1) {
      std::array<Quartet,_8UL>::operator[]
                ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,
                 (size_type)in_stack_fffffffffffff418);
      bVar1 = Quartet::operator_cast_to_bool(in_stack_fffffffffffff420);
      if (bVar1) {
        poVar3 = std::operator<<(local_10,(string *)indent6_abi_cxx11_);
        poVar3 = std::operator<<(poVar3,local_f8);
        poVar3 = std::operator<<(poVar3," = SIMINT_FMADD( ");
        poVar3 = std::operator<<(poVar3,local_698);
        poVar3 = std::operator<<(poVar3,", SIMINT_FMADD(");
        poVar3 = std::operator<<(poVar3,local_658);
        poVar3 = std::operator<<(poVar3,", ");
        poVar3 = std::operator<<(poVar3,local_1b8);
        poVar3 = std::operator<<(poVar3,", ");
        poVar3 = std::operator<<(poVar3,local_1d8);
        poVar3 = std::operator<<(poVar3,"), ");
        poVar3 = std::operator<<(poVar3,local_f8);
        std::operator<<(poVar3,");\n");
      }
    }
    std::array<Quartet,_8UL>::operator[]
              ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418
              );
    bVar1 = Quartet::operator_cast_to_bool(in_stack_fffffffffffff420);
    if (bVar1) {
      poVar3 = std::operator<<(local_10,(string *)indent6_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,local_f8);
      poVar3 = std::operator<<(poVar3," = SIMINT_FMADD( ");
      poVar3 = std::operator<<(poVar3,local_6b8);
      poVar3 = std::operator<<(poVar3,", ");
      in_stack_fffffffffffff4b0 = std::operator<<(poVar3,local_198);
      poVar3 = std::operator<<(in_stack_fffffffffffff4b0,", ");
      poVar3 = std::operator<<(poVar3,local_f8);
      std::operator<<(poVar3,");\n");
    }
    std::array<Quartet,_8UL>::operator[]
              ((array<Quartet,_8UL> *)in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418
              );
    in_stack_fffffffffffff49f = Quartet::operator_cast_to_bool(in_stack_fffffffffffff420);
    if ((bool)in_stack_fffffffffffff49f) {
      in_stack_fffffffffffff490 = std::operator<<(local_10,(string *)indent6_abi_cxx11_);
      in_stack_fffffffffffff488 = std::operator<<(in_stack_fffffffffffff490,local_f8);
      in_stack_fffffffffffff480 = std::operator<<(in_stack_fffffffffffff488," = SIMINT_FMADD( ");
      in_stack_fffffffffffff478 = (Quartet *)std::operator<<(in_stack_fffffffffffff480,local_6d8);
      in_stack_fffffffffffff470 = std::operator<<((ostream *)in_stack_fffffffffffff478,", ");
      in_stack_fffffffffffff468 = (QAM *)std::operator<<(in_stack_fffffffffffff470,local_178);
      poVar3 = std::operator<<((ostream *)in_stack_fffffffffffff468,", ");
      poVar3 = std::operator<<(poVar3,local_f8);
      std::operator<<(poVar3,");\n");
    }
    std::operator<<(local_10,"\n");
    std::__cxx11::string::~string(local_6d8);
    std::__cxx11::string::~string(local_6b8);
    std::__cxx11::string::~string(local_698);
    std::__cxx11::string::~string(local_678);
    std::__cxx11::string::~string(local_658);
    std::__cxx11::string::~string(local_638);
    local_bb0 = &QStack_158;
    do {
      in_stack_fffffffffffff440 = (QAM *)&local_bb0[-1].tag;
      std::__cxx11::string::~string((string *)in_stack_fffffffffffff440);
      local_bb0 = in_stack_fffffffffffff440;
    } while (in_stack_fffffffffffff440 != (QAM *)local_258);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string(local_d0);
    std::_Rb_tree_const_iterator<VRRStep>::operator++
              ((_Rb_tree_const_iterator<VRRStep> *)in_stack_fffffffffffff420);
  }
  poVar3 = std::operator<<(local_10,(string *)indent5_abi_cxx11_);
  std::operator<<(poVar3,"}\n");
  return;
}

Assistant:

void OSTEI_VRR_Writer::WriteVRRSteps_(std::ostream & os, QAM am, const VRR_StepSet & vs, const std::string & num_n) const
{
    os << "\n";
    os << indent5 << "// Forming " << PrimVarName(am) << "[" << num_n << " * " << NCART(am) << "];\n";

    os << indent5 << "for(n = 0; n < " << num_n << "; ++n)  // loop over orders of auxiliary function\n";
    os << indent5 << "{\n";

    os << "\n";

    // iterate over the requirements
    // should be in order since it's a set
    for(const auto & it : vs)
    {
        // Get the stepping
        XYZStep step = it.xyz;
        std::string stepdir = StringBuilder("[", static_cast<int>(step), "]");

        std::string primname = StringBuilder(PrimVarName(am), "[n * ", NCART(am), " + ", it.target.index(), "]");
        std::string srcname[8];

        if(it.src[0])
            srcname[0] = StringBuilder(PrimVarName(it.src[0].amlist()), "[n * ", it.src[0].ncart(), " + ", it.src[0].index(), "]");
        if(it.src[1])
            srcname[1] = StringBuilder( PrimVarName(it.src[1].amlist()), "[(n+1) * ", it.src[1].ncart(), " + ", it.src[1].index(), "]");
        if(it.src[2])
            srcname[2] = StringBuilder(PrimVarName(it.src[2].amlist()), "[n * ", it.src[2].ncart(), " + ", it.src[2].index(), "]");
        if(it.src[3])
            srcname[3] = StringBuilder(PrimVarName(it.src[3].amlist()), "[(n+1) * ", it.src[3].ncart(), " + ", it.src[3].index(), "]");
        if(it.src[4])
            srcname[4] = StringBuilder(PrimVarName(it.src[4].amlist()), "[n * ", it.src[4].ncart(), " + ", it.src[4].index(), "]");
        if(it.src[5])
            srcname[5] = StringBuilder(PrimVarName(it.src[5].amlist()), "[(n+1) * ", it.src[5].ncart(), " + ", it.src[5].index(), "]");
        if(it.src[6])
            srcname[6] = StringBuilder(PrimVarName(it.src[6].amlist()), "[(n+1) * ", it.src[6].ncart(), " + ", it.src[6].index(), "]");
        if(it.src[7])
            srcname[7] = StringBuilder(PrimVarName(it.src[7].amlist()), "[(n+1) * ", it.src[7].ncart(), " + ", it.src[7].index(), "]");

        std::string aoppq, aover;
        std::string vrr_const0, vrr_const1, vrr_const2, vrr_const3;

        // Note - the signs on a_over_p, a_over_q, etc, are taken care of in FileWriter.cpp
        if(it.type == RRStepType::I || it.type == RRStepType::J)
        {
            aoppq = StringBuilder("aop_PQ", stepdir);
            aover = "a_over_p";
            vrr_const0 = StringBuilder("vrr_const_", it.ijkl[0], "_over_2p");
            vrr_const1 = StringBuilder("vrr_const_", it.ijkl[1], "_over_2p");
            vrr_const2 = StringBuilder("vrr_const_", it.ijkl[2], "_over_2pq");
            vrr_const3 = StringBuilder("vrr_const_", it.ijkl[3], "_over_2pq");
        }
        else
        {
            aoppq = StringBuilder("aoq_PQ", stepdir);
            aover = "a_over_q";
            vrr_const0 = StringBuilder("vrr_const_", it.ijkl[2], "_over_2q");
            vrr_const1 = StringBuilder("vrr_const_", it.ijkl[3], "_over_2q");
            vrr_const2 = StringBuilder("vrr_const_", it.ijkl[0], "_over_2pq");
            vrr_const3 = StringBuilder("vrr_const_", it.ijkl[1], "_over_2pq");
        }


        if(it.type == RRStepType::I || it.type == RRStepType::J)
        {
            std::string ppa = StringBuilder("P_PA", stepdir);

            if(it.type != RRStepType::I)
                ppa = StringBuilder("P_PB", stepdir);

            os << indent6 << primname << " = SIMINT_MUL(" << ppa << ", " << srcname[0] << ");\n";
        }
        else
        {
            std::string qpa = StringBuilder("Q_PA", stepdir);

            if(it.type != RRStepType::K)
                qpa = StringBuilder("Q_PB", stepdir);

            os << indent6 << primname << " = SIMINT_MUL(" << qpa << ", " << srcname[0] << ");\n";
        }

        if(it.src[1])
            os << indent6 << primname << " = SIMINT_FMADD( " << aoppq << ", " << srcname[1] << ", " << primname << ");\n";
        if(it.src[2] && it.src[3])
            os << indent6 << primname << " = SIMINT_FMADD( " << vrr_const0 << ", SIMINT_FMADD(" << aover << ", " << srcname[3] << ", " << srcname[2] << "), " << primname << ");\n";
        if(it.src[4] && it.src[5])
            os << indent6 << primname << " = SIMINT_FMADD( " << vrr_const1 << ", SIMINT_FMADD(" << aover << ", " << srcname[5] << ", " << srcname[4] << "), " << primname << ");\n";
        if(it.src[6])
            os << indent6 << primname << " = SIMINT_FMADD( " << vrr_const2 << ", " << srcname[6] << ", " << primname << ");\n";
        if(it.src[7])
            os << indent6 << primname << " = SIMINT_FMADD( " << vrr_const3 << ", " << srcname[7] << ", " << primname << ");\n";
        
        os << "\n";

    }

    os << indent5 << "}\n";
}